

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoGeneric::SetVariables
          (ChConstraintTwoGeneric *this,ChVariables *mvariables_a,ChVariables *mvariables_b)

{
  int iVar1;
  
  if (mvariables_a == (ChVariables *)0x0 || mvariables_b == (ChVariables *)0x0) {
    (this->super_ChConstraintTwo).super_ChConstraint.valid = false;
    ChConstraint::UpdateActiveFlag((ChConstraint *)this);
    return;
  }
  (this->super_ChConstraintTwo).super_ChConstraint.valid = true;
  ChConstraint::UpdateActiveFlag((ChConstraint *)this);
  (this->super_ChConstraintTwo).variables_a = mvariables_a;
  (this->super_ChConstraintTwo).variables_b = mvariables_b;
  iVar1 = (*mvariables_a->_vptr_ChVariables[2])(mvariables_a);
  if (0 < iVar1) {
    iVar1 = (*((this->super_ChConstraintTwo).variables_a)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&(this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
               (long)iVar1);
    iVar1 = (*((this->super_ChConstraintTwo).variables_a)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_a);
  }
  iVar1 = (*((this->super_ChConstraintTwo).variables_b)->_vptr_ChVariables[2])();
  if (0 < iVar1) {
    iVar1 = (*((this->super_ChConstraintTwo).variables_b)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&(this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
               (long)iVar1);
    iVar1 = (*((this->super_ChConstraintTwo).variables_b)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_b);
    return;
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::SetVariables(ChVariables* mvariables_a, ChVariables* mvariables_b) {
    if (!mvariables_a || !mvariables_b) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;

    if (variables_a->Get_ndof() > 0) {
        Cq_a.resize(variables_a->Get_ndof());
        Eq_a.resize(variables_a->Get_ndof());
        Cq_a.setZero();
    }

    if (variables_b->Get_ndof() > 0) {
        Cq_b.resize(variables_b->Get_ndof());
        Eq_b.resize(variables_b->Get_ndof());
        Cq_b.setZero();
    }
}